

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

ActivationELU * __thiscall
CoreML::Specification::ActivationELU::New(ActivationELU *this,Arena *arena)

{
  ActivationELU *this_00;
  
  this_00 = (ActivationELU *)operator_new(0x18);
  ActivationELU(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationELU>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationELU* ActivationELU::New(::google::protobuf::Arena* arena) const {
  ActivationELU* n = new ActivationELU;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}